

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMImplementationImpl.cpp
# Opt level: O3

DOMLSParser * __thiscall
xercesc_4_0::DOMImplementationImpl::createLSParser
          (DOMImplementationImpl *this,DOMImplementationLSMode mode,XMLCh *param_2,
          MemoryManager *manager,XMLGrammarPool *gramPool)

{
  DOMLSParserImpl *this_00;
  DOMException *this_01;
  
  if (mode != MODE_ASYNCHRONOUS) {
    this_00 = (DOMLSParserImpl *)XMemory::operator_new(0x128,manager);
    DOMLSParserImpl::DOMLSParserImpl(this_00,(XMLValidator *)0x0,manager,gramPool);
    return &this_00->super_DOMLSParser;
  }
  this_01 = (DOMException *)__cxa_allocate_exception(0x28);
  DOMException::DOMException(this_01,9,0,manager);
  __cxa_throw(this_01,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

DOMLSParser* DOMImplementationImpl::createLSParser( const DOMImplementationLSMode   mode,
                                                    const XMLCh* const     /*schemaType*/,
                                                    MemoryManager* const  manager,
                                                    XMLGrammarPool* const gramPool)
{
    if (mode == DOMImplementationLS::MODE_ASYNCHRONOUS)
        throw DOMException(DOMException::NOT_SUPPORTED_ERR, 0, manager);

    // TODO: schemaType
    return new (manager) DOMLSParserImpl(0, manager, gramPool);
}